

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void gc_traverse_trace(global_State *g,GCtrace *T)

{
  uint uVar1;
  ulong uVar2;
  GCobj *pGVar3;
  ulong uVar4;
  
  if (T->traceno != 0) {
    uVar2 = (ulong)T->nk;
    if (uVar2 < 0x7ffd) {
      do {
        uVar4 = uVar2 + 1;
        if ((*(char *)((long)T->ir + uVar4 * 8 + -3) == '\x17') &&
           (pGVar3 = (GCobj *)(ulong)T->ir[uVar2].field_1.op12, ((pGVar3->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar3);
        }
        uVar2 = uVar4;
      } while ((int)uVar4 != 0x7ffd);
    }
    if ((ulong)T->link != 0) {
      uVar1 = *(uint *)(*(long *)(g[1].gcroot + 0xc) + (ulong)T->link * 4);
      uVar2 = (ulong)uVar1;
      if ((*(byte *)(uVar2 + 4) & 3) != 0) {
        *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfc;
        *(uint32_t *)(uVar2 + 0xc) = (g->gc).gray.gcptr32;
        (g->gc).gray.gcptr32 = uVar1;
      }
    }
    if ((ulong)T->nextroot != 0) {
      uVar1 = *(uint *)(*(long *)(g[1].gcroot + 0xc) + (ulong)T->nextroot * 4);
      uVar2 = (ulong)uVar1;
      if ((*(byte *)(uVar2 + 4) & 3) != 0) {
        *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfc;
        *(uint32_t *)(uVar2 + 0xc) = (g->gc).gray.gcptr32;
        (g->gc).gray.gcptr32 = uVar1;
      }
    }
    if ((ulong)T->nextside != 0) {
      uVar1 = *(uint *)(*(long *)(g[1].gcroot + 0xc) + (ulong)T->nextside * 4);
      uVar2 = (ulong)uVar1;
      if ((*(byte *)(uVar2 + 4) & 3) != 0) {
        *(byte *)(uVar2 + 4) = *(byte *)(uVar2 + 4) & 0xfc;
        *(uint32_t *)(uVar2 + 0xc) = (g->gc).gray.gcptr32;
        (g->gc).gray.gcptr32 = uVar1;
      }
    }
    pGVar3 = (GCobj *)(ulong)(T->startpt).gcptr32;
    if (((pGVar3->gch).marked & 3) != 0) {
      gc_mark(g,pGVar3);
      return;
    }
  }
  return;
}

Assistant:

static void gc_traverse_trace(global_State *g, GCtrace *T)
{
  IRRef ref;
  if (T->traceno == 0) return;
  for (ref = T->nk; ref < REF_TRUE; ref++) {
    IRIns *ir = &T->ir[ref];
    if (ir->o == IR_KGC)
      gc_markobj(g, ir_kgc(ir));
  }
  if (T->link) gc_marktrace(g, T->link);
  if (T->nextroot) gc_marktrace(g, T->nextroot);
  if (T->nextside) gc_marktrace(g, T->nextside);
  gc_markobj(g, gcref(T->startpt));
}